

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_test.cc
# Opt level: O2

void __thiscall RegisterLexerError::RegisterLexerError(RegisterLexerError *this)

{
  RegisterTest(LexerError::Create,"Lexer.Error");
  return;
}

Assistant:

TEST(Lexer, Error) {
  Lexer lexer("foo$\nbad $");
  EvalString eval;
  string err;
  ASSERT_FALSE(lexer.ReadVarValue(&eval, &err));
  EXPECT_EQ("input:2: bad $-escape (literal $ must be written as $$)\n"
            "bad $\n"
            "    ^ near here"
            , err);
}